

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_locate_num_blocks(Integer g_a,Integer *lo,Integer *hi)

{
  bool bVar1;
  bool bVar2;
  global_array_t *pgVar3;
  long lVar4;
  short sVar5;
  long lVar6;
  long lVar7;
  Integer IVar8;
  long lVar9;
  Integer thi [7];
  Integer tlo [7];
  
  lVar9 = g_a + 1000;
  sVar5 = GA[g_a + 1000].ndim;
  lVar6 = (long)sVar5;
  pgVar3 = GA;
  for (lVar7 = 0; lVar7 < sVar5; lVar7 = lVar7 + 1) {
    if (((lo[lVar7] < 1) || (hi[lVar7] < lo[lVar7])) || (pgVar3[g_a + 1000].dims[lVar7] < hi[lVar7])
       ) {
      pnga_error("Requested region out of bounds",0);
      sVar5 = GA[lVar9].ndim;
      pgVar3 = GA;
    }
  }
  if (pgVar3[lVar9].distr_type == 0) {
    IVar8 = -1;
  }
  else {
    IVar8 = 0;
    lVar7 = pgVar3[lVar9].block_total;
    if (pgVar3[lVar9].block_total < 1) {
      lVar7 = IVar8;
    }
    bVar2 = true;
    for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
      pnga_distribution(g_a,lVar9,tlo,thi);
      bVar1 = bVar2;
      for (lVar4 = 0; (bVar1 && (lVar4 < lVar6)); lVar4 = lVar4 + 1) {
        if (((tlo[lVar4] < lo[lVar4]) || (bVar1 = bVar2, hi[lVar4] < tlo[lVar4])) &&
           ((thi[lVar4] < lo[lVar4] || (bVar1 = bVar2, hi[lVar4] < thi[lVar4])))) {
          bVar1 = false;
        }
      }
      IVar8 = (IVar8 + 1) - (ulong)!bVar1;
    }
  }
  return IVar8;
}

Assistant:

Integer pnga_locate_num_blocks(Integer g_a, Integer *lo, Integer *hi)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer ndim = GA[ga_handle].ndim;
  Integer ret = -1, d;
  Integer cnt;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))
      pnga_error("Requested region out of bounds",0);

  if (GA[ga_handle].distr_type != REGULAR) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, i, j, tlo[MAXDIM], thi[MAXDIM];
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }

      if (chk) {
        cnt++;
      }
    }
    ret = cnt;
  }

  return ret;
}